

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

string * __thiscall
boost::deflate::inflate_stream_test::corpus2_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,size_t n)

{
  size_t __i;
  long lVar1;
  ulong uVar2;
  IDecompressor *pIVar3;
  uniform_int_distribution<unsigned_int> d0;
  mt19937 g;
  param_type local_13b8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_13b0._M_x[0] = 0x1571;
  lVar1 = 1;
  uVar2 = 0x1571;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar1);
    local_13b0._M_x[lVar1] = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x270);
  local_13b0._M_p = 0x270;
  local_13b8._M_a = 0;
  local_13b8._M_b = 0xff;
  pIVar3 = (IDecompressor *)
           ((long)&(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor + 1);
  while (pIVar3 = (IDecompressor *)((long)(pIVar3 + 0xffffffffffffffff) + 7),
        pIVar3 != (IDecompressor *)0x0) {
    std::uniform_int_distribution<unsigned_int>::operator()
              ((uniform_int_distribution<unsigned_int> *)&local_13b8,&local_13b0,&local_13b8);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static
    std::string corpus2(std::size_t n)
    {
        std::string s;
        s.reserve(n);
        std::mt19937 g;
        std::uniform_int_distribution<std::uint32_t> d0{0, 255};
        while(n--)
            s.push_back(static_cast<char>(d0(g)));
        return s;
    }